

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult fill_out_count_pointer_pair<VkQueueFamilyProperties>
                   (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    *data_vec,uint32_t *pCount,VkQueueFamilyProperties *pData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  VkResult VVar5;
  ulong uVar6;
  uint32_t amount_to_write;
  ulong uVar7;
  long lVar8;
  
  if (pCount != (uint32_t *)0x0) {
    uVar6 = (*(long *)(data_vec + 8) - *(long *)data_vec) / 0x18;
    if (pData == (VkQueueFamilyProperties *)0x0) {
      VVar5 = VK_SUCCESS;
    }
    else {
      uVar7 = uVar6 & 0xffffffff;
      if (*pCount < uVar6) {
        uVar7 = (ulong)*pCount;
      }
      for (lVar8 = 0; uVar7 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        lVar3 = *(long *)data_vec;
        *(undefined8 *)((long)&(pData->minImageTransferGranularity).height + lVar8) =
             *(undefined8 *)(lVar3 + 0x10 + lVar8);
        puVar1 = (undefined8 *)(lVar3 + lVar8);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pData->queueFlags + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
      }
      VVar5 = (uint)((ulong)*pCount < (ulong)((*(long *)(data_vec + 8) - *(long *)data_vec) / 0x18))
              * 5;
      uVar6 = uVar7;
    }
    *pCount = (uint32_t)uVar6;
    return VVar5;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}